

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void handle_parent_message(sockaddr_in addr_from)

{
  sockaddr_in addr_00;
  int iVar1;
  uchar auVar2 [8];
  uint32_t uVar3;
  Ip_Port IVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  key_type local_420;
  Ip_Port ip_port;
  sockaddr_in addr;
  char str_addr [1000];
  size_t size_addr;
  sockaddr_in addr_from_local;
  
  uVar3 = ntohl(*(uint32_t *)((long)buf + 8));
  strncpy((char *)addr.sin_zero,(char *)((long)buf + 0xc),(ulong)uVar3);
  IVar4 = addr_from._0_8_;
  auVar2 = addr_from.sin_zero;
  if (addr.sin_zero[0] != '0') {
    addr.sin_zero[uVar3] = '\0';
    parse_address((char *)addr.sin_zero,(sockaddr_in *)&ip_port);
    IVar4 = ip_port;
    auVar2 = (uchar  [8])addr._0_8_;
  }
  addr._0_8_ = auVar2;
  ip_port = IVar4;
  addr_00.sin_zero = (uchar  [8])addr._0_8_;
  addr_00._0_8_ = ip_port;
  IVar4 = get_ip_port(addr_00);
  local_420.first = IVar4.first;
  local_420.second = IVar4.second;
  sVar5 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&local_420);
  iVar1 = global_map_id;
  if (sVar5 == 0) {
    pmVar6 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_420);
    *pmVar6 = iVar1;
    pmVar7 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    *(Ip_Port *)pmVar7 = ip_port;
    *(undefined8 *)pmVar7->sin_zero = addr._0_8_;
    global_map_id = global_map_id + 1;
  }
  pmVar6 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&local_420);
  id_parent = *pmVar6;
  return;
}

Assistant:

void handle_parent_message(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }

    Ip_Port ip_port = get_ip_port(addr);
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        ++global_map_id;
    }

    id_parent = idconnections[ip_port];
}